

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000022f140 = 0x2e2e2e2e2e2e2e;
    uRam000000000022f147._0_1_ = '.';
    uRam000000000022f147._1_1_ = '.';
    uRam000000000022f147._2_1_ = '.';
    uRam000000000022f147._3_1_ = '.';
    uRam000000000022f147._4_1_ = '.';
    uRam000000000022f147._5_1_ = '.';
    uRam000000000022f147._6_1_ = '.';
    uRam000000000022f147._7_1_ = '.';
    DAT_0022f130 = '.';
    DAT_0022f130_1._0_1_ = '.';
    DAT_0022f130_1._1_1_ = '.';
    DAT_0022f130_1._2_1_ = '.';
    DAT_0022f130_1._3_1_ = '.';
    DAT_0022f130_1._4_1_ = '.';
    DAT_0022f130_1._5_1_ = '.';
    DAT_0022f130_1._6_1_ = '.';
    uRam000000000022f138 = 0x2e2e2e2e2e2e2e;
    DAT_0022f13f = 0x2e;
    DAT_0022f120 = '.';
    DAT_0022f120_1._0_1_ = '.';
    DAT_0022f120_1._1_1_ = '.';
    DAT_0022f120_1._2_1_ = '.';
    DAT_0022f120_1._3_1_ = '.';
    DAT_0022f120_1._4_1_ = '.';
    DAT_0022f120_1._5_1_ = '.';
    DAT_0022f120_1._6_1_ = '.';
    uRam000000000022f128._0_1_ = '.';
    uRam000000000022f128._1_1_ = '.';
    uRam000000000022f128._2_1_ = '.';
    uRam000000000022f128._3_1_ = '.';
    uRam000000000022f128._4_1_ = '.';
    uRam000000000022f128._5_1_ = '.';
    uRam000000000022f128._6_1_ = '.';
    uRam000000000022f128._7_1_ = '.';
    DAT_0022f110 = '.';
    DAT_0022f110_1._0_1_ = '.';
    DAT_0022f110_1._1_1_ = '.';
    DAT_0022f110_1._2_1_ = '.';
    DAT_0022f110_1._3_1_ = '.';
    DAT_0022f110_1._4_1_ = '.';
    DAT_0022f110_1._5_1_ = '.';
    DAT_0022f110_1._6_1_ = '.';
    uRam000000000022f118._0_1_ = '.';
    uRam000000000022f118._1_1_ = '.';
    uRam000000000022f118._2_1_ = '.';
    uRam000000000022f118._3_1_ = '.';
    uRam000000000022f118._4_1_ = '.';
    uRam000000000022f118._5_1_ = '.';
    uRam000000000022f118._6_1_ = '.';
    uRam000000000022f118._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000022f108._0_1_ = '.';
    uRam000000000022f108._1_1_ = '.';
    uRam000000000022f108._2_1_ = '.';
    uRam000000000022f108._3_1_ = '.';
    uRam000000000022f108._4_1_ = '.';
    uRam000000000022f108._5_1_ = '.';
    uRam000000000022f108._6_1_ = '.';
    uRam000000000022f108._7_1_ = '.';
    DAT_0022f14f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}